

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  size_type *psVar1;
  pointer pcVar2;
  FilePath *in_RDI;
  FilePath local_98;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  FilePath result;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  psVar1 = &result.pathname_._M_string_length;
  result.pathname_._M_dataplus._M_p = (pointer)0x0;
  result.pathname_._M_string_length._0_1_ = 0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)psVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&g_argvs_abi_cxx11_);
  if (local_78 !=
      (undefined1  [8])
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pcVar2 = ((_Alloc_hider *)local_78)->_M_p;
    result.pathname_.field_2._8_8_ = &local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&result.pathname_.field_2 + 8),pcVar2,
               pcVar2 + *(size_type *)((long)local_78 + 8));
    FilePath::FilePath(&local_98,(string *)((long)&result.pathname_.field_2 + 8));
    std::__cxx11::string::_M_assign
              ((string *)
               &args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.pathname_._M_dataplus._M_p != &local_98.pathname_.field_2) {
      operator_delete(local_98.pathname_._M_dataplus._M_p,
                      local_98.pathname_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result.pathname_.field_2._8_8_ != &local_30) {
      operator_delete((void *)result.pathname_.field_2._8_8_,local_30._M_allocated_capacity + 1);
    }
  }
  FilePath::RemoveDirectoryName
            (in_RDI,(FilePath *)
                    &args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  if (args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)psVar1) {
    operator_delete(args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    CONCAT71(result.pathname_._M_string_length._1_7_,
                             (undefined1)result.pathname_._M_string_length) + 1);
  }
  return in_RDI;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

  auto args = GetArgvs();
  if (!args.empty()) {
#if defined(GTEST_OS_WINDOWS) || defined(GTEST_OS_OS2)
    result.Set(FilePath(args[0]).RemoveExtension("exe"));
#else
    result.Set(FilePath(args[0]));
#endif  // GTEST_OS_WINDOWS
  }

  return result.RemoveDirectoryName();
}